

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

void sqlcheck::CheckDistinctJoin(Configuration *state,string *sql_statement,bool *print_statement)

{
  string title;
  string local_90;
  string local_70;
  regex pattern;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"(distinct.*join)",0x10);
  title._M_dataplus._M_p = (pointer)&title.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&title,"DISTINCT & JOIN Usage","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,title._M_dataplus._M_p,
             title._M_dataplus._M_p + title._M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,anon_var_dwarf_7b504,anon_var_dwarf_7b504 + 0x208);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,
               &local_90,&local_70,true,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)title._M_dataplus._M_p != &title.field_2) {
    operator_delete(title._M_dataplus._M_p);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckDistinctJoin(Configuration& state,
                       const std::string& sql_statement,
                       bool& print_statement){

  std::regex pattern("(distinct.*join)");
  std::string title = "DISTINCT & JOIN Usage";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Consider using a sub-query with EXISTS instead of DISTINCT:  "
      "The DISTINCT keyword removes duplicates after sorting the tuples. "
      "Instead, consider using a sub query with the EXISTS keyword, you can avoid "
      "having to return an entire table. "
      "EX: SELECT DISTINCT c.country_id, c.country_name FROM SH.countries c, "
      "SH.customers e WHERE e.country_id = c.country_id; "
      "can be rewritten to:  "
      "SELECT c.country_id, c.country_name FROM SH.countries c WHERE  EXISTS "
      "(SELECT 'X' FROM  SH.customers e WHERE e.country_id = c.country_id);";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true);

}